

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

bool __thiscall
iutest::detail::SizeIsMatcher<unsigned_int>::Check<int,3ul>
          (SizeIsMatcher<unsigned_int> *this,int (*param_1) [3])

{
  unsigned_long local_50;
  AssertionResult local_48;
  EqMatcher<unsigned_int> local_20;
  
  local_20.m_expected = &this->m_expected;
  local_20.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_0023e2d8;
  local_50 = 3;
  EqMatcher<unsigned_int>::operator()(&local_48,&local_20,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  return local_48.m_result;
}

Assistant:

bool Check(const U(&)[SIZE])
    {
        return static_cast<bool>(CastToMatcher(m_expected)(SIZE));
    }